

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void destroy_loop_tree(gen_ctx_t gen_ctx,loop_node_t_conflict root)

{
  loop_node_t_conflict plVar1;
  loop_node_t_conflict next;
  loop_node_t_conflict node;
  loop_node_t_conflict root_local;
  gen_ctx_t gen_ctx_local;
  
  if (root->bb == (bb_t)0x0) {
    next = DLIST_loop_node_t_head(&root->children);
    while (next != (loop_node_t_conflict)0x0) {
      plVar1 = DLIST_loop_node_t_next(next);
      destroy_loop_tree(gen_ctx,next);
      next = plVar1;
    }
  }
  else {
    (root->u).preheader = (loop_node_t)0x0;
    root->bb->loop_node = (loop_node_t_conflict)0x0;
  }
  free(root);
  return;
}

Assistant:

static void destroy_loop_tree (gen_ctx_t gen_ctx, loop_node_t root) {
  loop_node_t node, next;

  if (root->bb != NULL) {
    root->u.preheader_loop = NULL;
    root->bb->loop_node = NULL;
  } else {
    for (node = DLIST_HEAD (loop_node_t, root->children); node != NULL; node = next) {
      next = DLIST_NEXT (loop_node_t, node);
      destroy_loop_tree (gen_ctx, node);
    }
  }
  free (root);
}